

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.c
# Opt level: O0

void async_send_to_tester
               (pid_t tester_pid,char *word,_Bool completed,size_t total_processed,_Bool ignored,
               _Bool accepted)

{
  pid_t __pid;
  FILE *pFVar1;
  __pid_t pid;
  mqd_t tester_mq_00;
  uint uVar2;
  int iVar3;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  int tmp_err;
  pid_t child_pid;
  mqd_t tester_mq;
  char tester_mq_name [36];
  _Bool accepted_local;
  _Bool ignored_local;
  size_t total_processed_local;
  _Bool completed_local;
  char *word_local;
  pid_t tester_pid_local;
  
  pid = fork();
  if (pid == -1) {
    err = true;
  }
  else {
    if (pid == 0) {
      validator_mq_finish(false,validator_mq,&err);
      pFVar1 = _stderr;
      if ((err & 1U) != 0) {
        puVar4 = (uint *)__errno_location();
        uVar2 = *puVar4;
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar1,"%s - error number: %d (%s)\n","Failed to finish validator mq in async child"
                ,(ulong)uVar2,pcVar6);
        kill_all_exit();
      }
      tester_mq_get_name_from_pid(tester_pid,(char *)&child_pid);
      tester_mq_00 = tester_mq_start(false,(char *)&child_pid,&err);
      pFVar1 = _stderr;
      if ((err & 1U) != 0) {
        puVar4 = (uint *)__errno_location();
        uVar2 = *puVar4;
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar1,"%s - error number: %d (%s)\n","Failed to open tester mq in async child",
                (ulong)uVar2,pcVar6);
        kill_all_exit();
      }
      current_tester_mq = tester_mq_00;
      tester_mq_send(tester_mq_00,word,completed,total_processed,ignored,accepted,&err);
      pFVar1 = _stderr;
      if ((err & 1U) != 0) {
        puVar4 = (uint *)__errno_location();
        uVar2 = *puVar4;
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar1,"%s - error number: %d (%s)\n","Failed to send to tester mq in async child",
                (ulong)uVar2,pcVar6);
        kill_all_exit();
      }
      uVar2 = getpid();
      log_formatted("%d - SND: %s, COMPLETED=%d, IGNORED=%d, ACCEPTED=%d, EXPECTED_RCD_PASSED=%d",
                    (ulong)uVar2,word,(ulong)completed,(ulong)ignored,(ulong)accepted,
                    total_processed);
      tester_mq_finish(false,tester_mq_00,(char *)0x0,&err);
      pFVar1 = _stderr;
      if ((err & 1U) != 0) {
        puVar4 = (uint *)__errno_location();
        uVar2 = *puVar4;
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fprintf(pFVar1,"%s - error number: %d (%s)\n","Failed to close tester mq in async child",
                (ulong)uVar2,pcVar6);
        kill_all_exit();
      }
      __pid = main_pid;
      if (word != (char *)0x0) {
        iVar3 = __libc_current_sigrtmin();
        iVar3 = kill(__pid,iVar3 + 1);
        pFVar1 = _stderr;
        err = iVar3 == -1;
        if (err) {
          puVar4 = (uint *)__errno_location();
          uVar2 = *puVar4;
          piVar5 = __errno_location();
          pcVar6 = strerror(*piVar5);
          fprintf(pFVar1,"%s - error number: %d (%s)\n",
                  "Failed notify main process about successful send",(ulong)uVar2,pcVar6);
          kill_all_exit();
        }
      }
      exit(0);
    }
    await_forks = await_forks + 1;
    pid_list_emplace(children,pid,&err);
  }
  return;
}

Assistant:

static void async_send_to_tester(pid_t tester_pid, const char *word, bool completed, size_t total_processed, bool ignored,
                          bool accepted) {
    assert(err == false);

    char tester_mq_name[TESTER_MQ_NAME_LEN];
    mqd_t tester_mq;
    pid_t child_pid;
    switch (child_pid = fork()) {
        case -1:
            err = true;
            break;
        case 0:
            validator_mq_finish(false, validator_mq, &err);
            HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to finish validator mq in async child");

            tester_mq_get_name_from_pid(tester_pid, tester_mq_name);
            tester_mq = tester_mq_start(false, tester_mq_name, &err);
            HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to open tester mq in async child");
            current_tester_mq = tester_mq; // for optimal error handling

            tester_mq_send(tester_mq, word, completed, total_processed, ignored, accepted, &err);
            HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to send to tester mq in async child");
            log_formatted("%d - SND: %s, COMPLETED=%d, IGNORED=%d, ACCEPTED=%d, EXPECTED_RCD_PASSED=%d", getpid(), word, completed, ignored, accepted, total_processed);

            tester_mq_finish(false, tester_mq, NULL, &err);
            HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed to close tester mq in async child");

            if(word) {
                int tmp_err = kill(main_pid, SIG_SNT_SUCCESS);
                err = (tmp_err == -1);
                HANDLE_ERR_WITH_MSG(kill_all_exit, "Failed notify main process about successful send");
            }
            exit(EXIT_SUCCESS);

        default:
            await_forks++;
            pid_list_emplace(children, child_pid, &err);
            break;
    }
}